

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_TransferPermute(DdManager *ddSource,DdManager *ddDestination,DdNode *f,int *Permute)

{
  DdNode *pDVar1;
  DdNode *bRes;
  int *Permute_local;
  DdNode *f_local;
  DdManager *ddDestination_local;
  DdManager *ddSource_local;
  
  do {
    ddDestination->reordered = 0;
    pDVar1 = extraTransferPermute(ddSource,ddDestination,f,Permute);
  } while (ddDestination->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_TransferPermute( DdManager * ddSource, DdManager * ddDestination, DdNode * f, int * Permute )
{
    DdNode * bRes;
    do
    {
        ddDestination->reordered = 0;
        bRes = extraTransferPermute( ddSource, ddDestination, f, Permute );
    }
    while ( ddDestination->reordered == 1 );
    return ( bRes );

}